

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O3

void __thiscall
soplex::SPxBasisBase<double>::loadBasisSolver
          (SPxBasisBase<double> *this,SLinSolver<double> *p_solver,bool destroy)

{
  SPxOut *pSVar1;
  char cVar2;
  Verbosity old_verbosity;
  Verbosity local_2c;
  
  pSVar1 = p_solver->spxout;
  this->spxout = pSVar1;
  if ((pSVar1 != (SPxOut *)0x0) && (4 < (int)pSVar1->m_verbosity)) {
    local_2c = pSVar1->m_verbosity;
    (*pSVar1->_vptr_SPxOut[2])();
    pSVar1 = this->spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar1->m_streams[pSVar1->m_verbosity],
               "IBASIS03 loading of Solver invalidates factorization",0x34);
    cVar2 = (char)pSVar1->m_streams[pSVar1->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar1->m_streams[pSVar1->m_verbosity] + -0x18) +
                    cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_2c);
  }
  if ((this->freeSlinSolver == true) && (this->factor != (SLinSolver<double> *)0x0)) {
    (*this->factor->_vptr_SLinSolver[0x1c])();
  }
  this->factor = p_solver;
  this->factorized = false;
  (*p_solver->_vptr_SLinSolver[2])(p_solver);
  this->freeSlinSolver = destroy;
  return;
}

Assistant:

void SPxBasisBase<R>::loadBasisSolver(SLinSolver<R>* p_solver, const bool destroy)
{
   assert(!freeSlinSolver || factor != nullptr);

   setOutstream(*p_solver->spxout);

   SPX_MSG_INFO3((*this->spxout),
                 (*this->spxout) << "IBASIS03 loading of Solver invalidates factorization"
                 << std::endl;)

   if(freeSlinSolver)
   {
      delete factor;
      factor = nullptr;
   }

   factor = p_solver;
   factorized = false;
   factor->clear();
   freeSlinSolver = destroy;
}